

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

CService * ResolveService(CService *__return_storage_ptr__,string *ip,uint16_t port)

{
  long lVar1;
  DNSLookupFn dns_lookup_function;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *this;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  readonly_property<bool> in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef1;
  shared_count sStack_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_d8;
  uint16_t port_local;
  undefined1 local_b0 [24];
  string *local_98;
  string local_88;
  optional<CService> serv;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = &local_d8;
  port_local = port;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function(this,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffedc;
  dns_lookup_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffed8;
  dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffee0;
  dns_lookup_function.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffee8;
  dns_lookup_function._M_invoker._0_1_ = in_stack_fffffffffffffef0.super_class_property<bool>.value;
  dns_lookup_function._M_invoker._1_7_ = in_stack_fffffffffffffef1;
  Lookup(&serv,ip,port,false,dns_lookup_function);
  std::_Function_base::~_Function_base(&local_d8.super__Function_base);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)this;
  file.m_end = (iterator)0x2d;
  file.m_begin = (iterator)&local_e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
  sStack_100.pi_ = (sp_counted_base *)0x0;
  tinyformat::format<std::__cxx11::string,unsigned_short>
            (&local_88,(tinyformat *)"failed to resolve: %s:%i",(char *)ip,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_local,
             (unsigned_short *)this);
  local_b0[8] = false;
  local_b0._0_8_ = &PTR__lazy_ostream_01139e30;
  local_b0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_98 = &local_88;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&stack0xfffffffffffffef0,(lazy_ostream *)local_b0,1,1,WARN,0xb4ec59
             ,(size_t)&stack0xfffffffffffffee0,0x2d);
  std::__cxx11::string::~string((string *)&local_88);
  boost::detail::shared_count::~shared_count(&sStack_100);
  CService::CService((CService *)local_b0);
  std::optional<CService>::value_or<CService>(__return_storage_ptr__,&serv,(CService *)local_b0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_b0);
  std::_Optional_payload_base<CService>::_M_reset((_Optional_payload_base<CService> *)&serv);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static CService ResolveService(const std::string& ip, uint16_t port = 0)
{
    const std::optional<CService> serv{Lookup(ip, port, false)};
    BOOST_CHECK_MESSAGE(serv.has_value(), strprintf("failed to resolve: %s:%i", ip, port));
    return serv.value_or(CService{});
}